

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImGuiTableColumn *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiTableInstanceData *pIVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ImGuiTableCellData *pIVar14;
  int iVar15;
  ImGuiTableCellData *pIVar16;
  int iVar17;
  ImU32 col;
  ImU32 col_00;
  uint uVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  float fVar28;
  ImVec2 local_80;
  ImVec2 local_78;
  ImU32 local_70;
  int local_6c;
  int local_68;
  int local_64;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar9 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar9->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar24 = table->RowPosY2;
  auVar21 = ZEXT416((uint)fVar24);
  (pIVar4->DC).CursorPos.y = fVar24;
  fVar26 = table->RowPosY1;
  auVar27 = ZEXT416((uint)fVar26);
  iVar13 = table->CurrentRow;
  iVar15 = (int)table->FreezeRowsCount;
  iVar17 = (int)table->FreezeRowsRequest;
  if (iVar13 == 0) {
    if ((long)table->InstanceCurrent == 0) {
      pIVar10 = &table->InstanceDataFirst;
    }
    else {
      pIVar10 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
    }
    pIVar10->LastFirstRowHeight = fVar24 - fVar26;
  }
  iVar13 = iVar13 + 1;
  if (((table->InnerClipRect).Min.y <= fVar24) && (fVar26 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_6c = iVar17;
    local_58 = auVar27;
    local_48 = auVar21;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
    }
    col = table->RowBgColor[1];
    local_70 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_70 = 0, (table->Flags & 0x80) != 0)) {
      local_70 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    local_64 = iVar13;
    if ((-1 < cVar3 || iVar13 == iVar15) || (local_70 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar24 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar26 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar20 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = pIVar4->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar24;
        (pIVar5->_CmdHeader).ClipRect.z = fVar26;
        (pIVar5->_CmdHeader).ClipRect.w = fVar20;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BgClipRect).Min;
      fVar24 = (table->WorkRect).Min.x;
      fVar26 = IVar2.x;
      fVar20 = IVar2.y;
      uVar18 = -(uint)(fVar26 <= fVar24);
      uVar19 = -(uint)(fVar20 <= (float)local_58._0_4_);
      local_80.x = (float)(~uVar18 & (uint)fVar26 | (uint)fVar24 & uVar18);
      local_80.y = (float)(~uVar19 & (uint)fVar20 | local_58._0_4_ & uVar19);
      auVar27._8_8_ = 0;
      auVar27._0_4_ = (table->BgClipRect).Max.x;
      auVar27._4_4_ = (table->BgClipRect).Max.y;
      auVar21._4_4_ = local_48._0_4_;
      auVar21._0_4_ = (table->WorkRect).Max.x;
      auVar21._8_4_ = 0;
      auVar21._12_4_ = local_48._4_4_;
      auVar21 = minps(auVar21,auVar27);
      local_78 = auVar21._0_8_;
      if ((col_00 != 0) && (local_80.y < auVar21._4_4_)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col_00,0.0,0);
      }
      if ((col != 0) && (local_80.y < local_78.y)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col,0.0,0);
      }
    }
    local_68 = iVar15;
    if ((-1 < cVar3) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar14 = (table->RowCellData).Data;
      pIVar16 = pIVar14 + table->RowCellDataCurrent;
      do {
        cVar3 = pIVar14->Column;
        pIVar6 = (table->Columns).Data;
        fVar24 = (table->WorkRect).Min.x;
        uVar18 = -(uint)(fVar24 <= pIVar6[cVar3].MinX);
        fVar26 = (table->WorkRect).Max.x;
        fVar20 = pIVar6[cVar3].MaxX;
        if (fVar26 <= pIVar6[cVar3].MaxX) {
          fVar20 = fVar26;
        }
        fVar28 = (float)(~uVar18 & (uint)fVar24 | (uint)pIVar6[cVar3].MinX & uVar18);
        IVar2 = (table->BgClipRect).Min;
        auVar22._4_4_ = table->RowPosY2;
        auVar22._0_4_ = fVar20;
        auVar22._8_8_ = 0;
        fVar24 = IVar2.x;
        fVar26 = IVar2.y;
        uVar18 = -(uint)(fVar24 <= fVar28);
        uVar19 = -(uint)(fVar26 <= table->RowPosY1);
        fVar20 = (float)(~uVar18 & (uint)fVar24 | (uint)fVar28 & uVar18);
        local_80.y = (float)(~uVar19 & (uint)fVar26 | (uint)table->RowPosY1 & uVar19);
        auVar25._8_8_ = 0;
        auVar25._0_4_ = (table->BgClipRect).Max.x;
        auVar25._4_4_ = (table->BgClipRect).Max.y;
        auVar21 = minps(auVar22,auVar25);
        fVar24 = pIVar6[cVar3].ClipRect.Min.x;
        uVar18 = -(uint)(fVar24 <= fVar20);
        local_80.x = (float)(~uVar18 & (uint)fVar24 | (uint)fVar20 & uVar18);
        auVar23 = auVar21;
        if (pIVar6[cVar3].MaxX <= auVar21._0_4_) {
          auVar23._4_12_ = auVar21._4_12_;
          auVar23._0_4_ = pIVar6[cVar3].MaxX;
        }
        local_78.y = auVar21._4_4_;
        local_78.x = auVar23._0_4_;
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,pIVar14->BgColor,0.0,0);
        pIVar14 = pIVar14 + 1;
      } while (pIVar14 <= pIVar16);
    }
    if (((local_70 != 0) && ((table->BgClipRect).Min.y <= (float)local_58._0_4_)) &&
       ((float)local_58._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.x = table->BorderX1;
      local_80.y = (float)local_58._0_4_;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_58._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,local_70,1.0);
    }
    iVar13 = local_64;
    iVar15 = local_68;
    iVar17 = local_6c;
    if (((local_64 == local_68) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.x = table->BorderX1;
      local_80.y = (float)local_48._0_4_;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar13 == iVar17) && (0 < table->ColumnsCount)) {
    lVar11 = 0x62;
    lVar12 = 0;
    do {
      *(bool *)((long)&((table->Columns).Data)->Flags + lVar11) = lVar12 < table->FreezeColumnsCount
      ;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x68;
    } while (lVar12 < table->ColumnsCount);
  }
  if (iVar13 == iVar15) {
    table->IsUnfrozenRows = true;
    fVar24 = table->RowPosY2;
    fVar26 = (pIVar4->InnerClipRect).Min.y;
    uVar18 = -(uint)(fVar26 <= fVar24 + 1.0);
    fVar20 = (float)(~uVar18 & (uint)fVar26 | (uint)(fVar24 + 1.0) & uVar18);
    fVar26 = (pIVar4->InnerClipRect).Max.y;
    if (fVar26 <= fVar20) {
      fVar20 = fVar26;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar20;
    (table->BgClipRect).Min.y = fVar20;
    fVar26 = (pIVar4->InnerClipRect).Max.y;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar26;
    (table->BgClipRect).Max.y = fVar26;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar26 = table->RowPosY1;
    fVar20 = (fVar24 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar4->DC).CursorPos.y = fVar20;
    table->RowPosY2 = fVar20;
    table->RowPosY1 = fVar20 - (fVar24 - fVar26);
    if (0 < table->ColumnsCount) {
      lVar11 = 0x59;
      lVar12 = 0;
      do {
        pIVar6 = (table->Columns).Data;
        *(undefined1 *)((long)pIVar6 + lVar11 + -2) = *(undefined1 *)((long)&pIVar6->Flags + lVar11)
        ;
        *(float *)((long)pIVar6 + lVar11 + -0x35) = (table->Bg2ClipRectForDrawCmd).Min.y;
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x68;
      } while (lVar12 < table->ColumnsCount);
    }
    pIVar6 = (table->Columns).Data;
    IVar2 = (pIVar6->ClipRect).Min;
    IVar7 = (pIVar6->ClipRect).Max;
    IVar8 = (pIVar6->ClipRect).Max;
    (pIVar4->ClipRect).Min = (pIVar6->ClipRect).Min;
    (pIVar4->ClipRect).Max = IVar8;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = IVar2.x;
    (pIVar5->_CmdHeader).ClipRect.y = IVar2.y;
    (pIVar5->_CmdHeader).ClipRect.z = IVar7.x;
    (pIVar5->_CmdHeader).ClipRect.w = IVar7.y;
    pIVar1 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar2.x;
    pIVar1->y = IVar2.y;
    pIVar1->z = IVar7.x;
    pIVar1->w = IVar7.y;
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,pIVar4->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}